

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O3

void __thiscall
cmCursesMainForm::Render(cmCursesMainForm *this,int left,int top,int width,int height)

{
  cmState *pcVar1;
  bool bVar2;
  cmCursesStringWidget *sw;
  FIELD *field;
  void *pvVar3;
  vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_> *pvVar4;
  char *pcVar5;
  char *pcVar6;
  FORM *pFVar7;
  int iVar8;
  uint uVar9;
  pointer ppcVar10;
  undefined4 in_register_00000034;
  allocator local_95;
  int local_94;
  string local_90;
  int local_6c;
  string local_68;
  uint local_44;
  uint local_40;
  int local_3c;
  undefined8 local_38;
  
  local_38 = CONCAT44(in_register_00000034,left);
  pFVar7 = (this->super_cmCursesForm).Form;
  local_3c = top;
  if (pFVar7 != (FORM *)0x0) {
    field = current_field(pFVar7);
    pvVar3 = field_userptr(field);
    if (*(int *)((long)pvVar3 + 8) - 1U < 3) {
      *(undefined1 *)((long)pvVar3 + 0x3c) = 0;
    }
    unpost_form((this->super_cmCursesForm).Form);
    free_form((this->super_cmCursesForm).Form);
    (this->super_cmCursesForm).Form = (FORM *)0x0;
  }
  if (((0x40 < width) && (5 < height)) && (this->InitialWidth <= width)) {
    local_94 = height;
    if (this->AdvancedMode == true) {
      pvVar4 = this->Entries;
      this->NumberOfVisibleEntries =
           (long)(pvVar4->
                 super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(pvVar4->
                 super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 3;
    }
    else {
      this->NumberOfVisibleEntries = 0;
      pvVar4 = this->Entries;
      ppcVar10 = (pvVar4->
                 super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      if (ppcVar10 !=
          (pvVar4->
          super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        do {
          pcVar1 = this->CMakeInstance->State;
          pcVar5 = cmCursesCacheEntryComposite::GetValue(*ppcVar10);
          std::__cxx11::string::string((string *)&local_90,pcVar5,(allocator *)&local_68);
          pcVar5 = cmState::GetCacheEntryValue(pcVar1,&local_90);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          pcVar1 = this->CMakeInstance->State;
          pcVar6 = cmCursesCacheEntryComposite::GetValue(*ppcVar10);
          std::__cxx11::string::string((string *)&local_90,pcVar6,&local_95);
          local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"ADVANCED","");
          bVar2 = cmState::GetCacheEntryPropertyAsBool(pcVar1,&local_90,&local_68);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != &local_68.field_2) {
            operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          if ((pcVar5 != (char *)0x0) && ((!bVar2 || (this->AdvancedMode != false)))) {
            this->NumberOfVisibleEntries = this->NumberOfVisibleEntries + 1;
          }
          ppcVar10 = ppcVar10 + 1;
          pvVar4 = this->Entries;
        } while (ppcVar10 !=
                 (pvVar4->
                 super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish);
      }
    }
    this->NumberOfPages = 1;
    if ((7 < local_94) &&
       (ppcVar10 = (pvVar4->
                   super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
                   )._M_impl.super__Vector_impl_data._M_start,
       ppcVar10 !=
       (pvVar4->
       super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
       )._M_impl.super__Vector_impl_data._M_finish)) {
      local_94 = local_94 + -7;
      local_40 = (int)local_38 + 0x20;
      local_44 = (int)local_38 + 0x21;
      local_6c = 0;
      do {
        pcVar1 = this->CMakeInstance->State;
        pcVar5 = cmCursesCacheEntryComposite::GetValue(*ppcVar10);
        std::__cxx11::string::string((string *)&local_90,pcVar5,(allocator *)&local_68);
        pcVar5 = cmState::GetCacheEntryValue(pcVar1,&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        pcVar1 = this->CMakeInstance->State;
        pcVar6 = cmCursesCacheEntryComposite::GetValue(*ppcVar10);
        std::__cxx11::string::string((string *)&local_90,pcVar6,&local_95);
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"ADVANCED","");
        bVar2 = cmState::GetCacheEntryPropertyAsBool(pcVar1,&local_90,&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if ((pcVar5 != (char *)0x0) && ((!bVar2 || (this->AdvancedMode != false)))) {
          iVar8 = local_6c % local_94;
          bVar2 = 0 < local_6c / local_94;
          if (iVar8 == 0 && bVar2) {
            this->NumberOfPages = this->NumberOfPages + 1;
          }
          uVar9 = iVar8 + local_3c;
          (*((*ppcVar10)->Label->super_cmCursesWidget)._vptr_cmCursesWidget[3])
                    ((*ppcVar10)->Label,local_38,(ulong)uVar9,(ulong)(iVar8 == 0 && bVar2));
          (*((*ppcVar10)->IsNewLabel->super_cmCursesWidget)._vptr_cmCursesWidget[3])
                    ((*ppcVar10)->IsNewLabel,(ulong)local_40,(ulong)uVar9,0);
          (*(*ppcVar10)->Entry->_vptr_cmCursesWidget[3])
                    ((*ppcVar10)->Entry,(ulong)local_44,(ulong)uVar9,0);
          (*ppcVar10)->Entry->Page = this->NumberOfPages;
          local_6c = local_6c + 1;
        }
        ppcVar10 = ppcVar10 + 1;
      } while (ppcVar10 !=
               (this->Entries->
               super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
               )._M_impl.super__Vector_impl_data._M_finish);
    }
    pFVar7 = new_form(this->Fields);
    (this->super_cmCursesForm).Form = pFVar7;
    post_form(pFVar7);
    (*(this->super_cmCursesForm)._vptr_cmCursesForm[4])(this);
    PrintKeys(this,0);
    if (_stdscr == 0) {
      iVar8 = -1;
    }
    else {
      iVar8 = *(short *)(_stdscr + 4) + 1;
    }
    wtouchln(_stdscr,0,iVar8,1);
    refresh();
  }
  return;
}

Assistant:

void cmCursesMainForm::Render(int left, int top, int width, int height)
{

  if (this->Form) {
    FIELD* currentField = current_field(this->Form);
    cmCursesWidget* cw =
      reinterpret_cast<cmCursesWidget*>(field_userptr(currentField));
    // If in edit mode, get out of it
    if (cw->GetType() == cmStateEnums::STRING ||
        cw->GetType() == cmStateEnums::PATH ||
        cw->GetType() == cmStateEnums::FILEPATH) {
      cmCursesStringWidget* sw = static_cast<cmCursesStringWidget*>(cw);
      sw->SetInEdit(false);
    }
    // Delete the previous form
    unpost_form(this->Form);
    free_form(this->Form);
    this->Form = CM_NULLPTR;
  }

  // Wrong window size
  if (width < cmCursesMainForm::MIN_WIDTH || width < this->InitialWidth ||
      height < cmCursesMainForm::MIN_HEIGHT) {
    return;
  }

  // Leave room for toolbar
  height -= 7;

  if (this->AdvancedMode) {
    this->NumberOfVisibleEntries = this->Entries->size();
  } else {
    // If normal, display only non-advanced entries
    this->NumberOfVisibleEntries = 0;
    std::vector<cmCursesCacheEntryComposite*>::iterator it;
    for (it = this->Entries->begin(); it != this->Entries->end(); ++it) {
      const char* existingValue =
        this->CMakeInstance->GetState()->GetCacheEntryValue((*it)->GetValue());
      bool advanced =
        this->CMakeInstance->GetState()->GetCacheEntryPropertyAsBool(
          (*it)->GetValue(), "ADVANCED");
      if (!existingValue || (!this->AdvancedMode && advanced)) {
        continue;
      }
      this->NumberOfVisibleEntries++;
    }
  }

  // Re-adjust the fields according to their place
  this->NumberOfPages = 1;
  if (height > 0) {
    bool isNewPage;
    int i = 0;
    std::vector<cmCursesCacheEntryComposite*>::iterator it;
    for (it = this->Entries->begin(); it != this->Entries->end(); ++it) {
      const char* existingValue =
        this->CMakeInstance->GetState()->GetCacheEntryValue((*it)->GetValue());
      bool advanced =
        this->CMakeInstance->GetState()->GetCacheEntryPropertyAsBool(
          (*it)->GetValue(), "ADVANCED");
      if (!existingValue || (!this->AdvancedMode && advanced)) {
        continue;
      }
      int row = (i % height) + 1;
      int page = (i / height) + 1;
      isNewPage = (page > 1) && (row == 1);

      if (isNewPage) {
        this->NumberOfPages++;
      }
      (*it)->Label->Move(left, top + row - 1, isNewPage);
      (*it)->IsNewLabel->Move(left + 32, top + row - 1, false);
      (*it)->Entry->Move(left + 33, top + row - 1, false);
      (*it)->Entry->SetPage(this->NumberOfPages);
      i++;
    }
  }

  // Post the form
  this->Form = new_form(this->Fields);
  post_form(this->Form);
  // Update toolbar
  this->UpdateStatusBar();
  this->PrintKeys();

  touchwin(stdscr);
  refresh();
}